

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmInstruction *
anon_unknown.dwarf_13465d::GetCopyInfo
          (VmModule *module,VmValue *pointer,VmConstant *offset,uint accessSize)

{
  VariableData *pVVar1;
  VmInstruction *pVVar2;
  VmConstant *pVVar3;
  VmInstruction *in_RAX;
  int iVar4;
  VmInstruction **ppVVar5;
  VmConstant **ppVVar6;
  VmValue *pVVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  
  if (offset == (VmConstant *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = offset->iValue;
  }
  if ((pointer == (VmValue *)0x0) || (pVVar7 = pointer, pointer->typeID != 1)) {
    pVVar7 = (VmValue *)0x0;
  }
  if (pVVar7 == (VmValue *)0x0) {
    uVar8 = (ulong)(module->loadStoreInfo).count;
    bVar10 = uVar8 != 0;
    if (bVar10) {
      ppVVar6 = &((module->loadStoreInfo).data)->storeOffset;
      uVar9 = 1;
      do {
        pVVar2 = (VmInstruction *)ppVVar6[-7];
        bVar11 = true;
        if ((((pVVar2 != (VmInstruction *)0x0) &&
             (&ppVVar6[-1]->super_VmValue == pointer &&
              &ppVVar6[-1]->super_VmValue != (VmValue *)0x0)) && ((*ppVVar6)->iValue == iVar4)) &&
           (*(uint *)(ppVVar6 + -6) == accessSize)) {
          if (pVVar2->parent == (VmBlock *)0x0) {
            __assert_fail("el.copyInst->parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x701,
                          "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                         );
          }
          bVar11 = false;
          in_RAX = pVVar2;
        }
        if (!bVar11) break;
        bVar10 = uVar9 < uVar8;
        ppVVar6 = ppVVar6 + 0xb;
        bVar11 = uVar9 != uVar8;
        uVar9 = uVar9 + 1;
      } while (bVar11);
    }
    if (bVar10) {
      return in_RAX;
    }
  }
  else {
    pVVar1 = (VariableData *)pVVar7[1].comment.end;
    if (pVVar1 != (VariableData *)0x0) {
      if (iVar4 != 0) {
        __assert_fail("offsetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6e6,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
      uVar8 = (ulong)(module->loadStoreInfo).count;
      bVar10 = uVar8 != 0;
      if (bVar10) {
        ppVVar5 = &((module->loadStoreInfo).data)->copyInst;
        uVar9 = 1;
        do {
          pVVar2 = *ppVVar5;
          bVar11 = true;
          if (((pVVar2 != (VmInstruction *)0x0) &&
              (pVVar3 = (VmConstant *)ppVVar5[5], pVVar3 != (VmConstant *)0x0)) &&
             ((pVVar3->container == pVVar1 &&
              ((pVVar3->iValue == *(int *)&pVVar7[1]._vptr_VmValue &&
               (*(uint *)(ppVVar5 + 1) == accessSize)))))) {
            if (pVVar2->parent == (VmBlock *)0x0) {
              __assert_fail("el.copyInst->parent",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x6f0,
                            "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                           );
            }
            bVar11 = false;
            in_RAX = pVVar2;
          }
          if (!bVar11) break;
          bVar10 = uVar9 < uVar8;
          ppVVar5 = ppVVar5 + 0xb;
          bVar11 = uVar9 != uVar8;
          uVar9 = uVar9 + 1;
        } while (bVar11);
      }
      if (bVar10) {
        return in_RAX;
      }
    }
  }
  return (VmInstruction *)0x0;
}

Assistant:

VmInstruction* GetCopyInfo(VmModule *module, VmValue *pointer, VmConstant *offset, unsigned accessSize)
	{
		int offsetValue = offset ? offset->iValue : 0;

		if(VmConstant *address = getType<VmConstant>(pointer))
		{
			if(!address->container)
				return NULL;

			assert(offsetValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storeAddress)
				{
					if(el.storeAddress->container == address->container && el.storeAddress->iValue == address->iValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storePointer)
				{
					if(el.storePointer == pointer && el.storeOffset->iValue == offsetValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}

		return NULL;
	}